

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O2

string * license::test::generate_license
                   (string *__return_storage_ptr__,string *license_name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *other_args)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  int sectionSize;
  SI_Error rc;
  int retCode;
  string *local_418;
  string license_name_norm;
  undefined4 local_3ec;
  path license_fname;
  path licenses_base;
  undefined1 local_3a8 [24];
  char *local_390;
  _Rb_tree_node_base local_388;
  size_t local_368;
  _List_node_base local_360;
  undefined7 local_350;
  undefined4 uStack_349;
  bool local_345;
  int local_344;
  undefined8 local_338;
  ulong local_330;
  shared_count sStack_328;
  char *local_320;
  string license_fname_s;
  path lcc_exe;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream ss;
  undefined1 *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  
  local_418 = __return_storage_ptr__;
  boost::filesystem::path::path
            (&lcc_exe,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O2/extern/license-generator/src/license_generator/lccgen"
            );
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x1e);
  bVar1 = boost::filesystem::is_regular_file(&lcc_exe);
  local_3a8[0] = bVar1;
  local_3a8._8_8_ = 0;
  local_3a8._16_8_ = 0;
  _ss = &PTR__lazy_ostream_0056b770;
  local_1a8 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x43856e;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_1e0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_3a8 + 0x10));
  boost::filesystem::path::path
            (&licenses_base,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O2/Testing/Temporary/DEFAULT/licenses"
            );
  bVar1 = boost::filesystem::exists(&licenses_base);
  if (!bVar1) {
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x21);
    license_name_norm._M_dataplus._M_p._0_1_ = boost::filesystem::create_directories(&licenses_base)
    ;
    license_name_norm._M_string_length = 0;
    license_name_norm.field_2._M_allocated_capacity = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                   "test folders created ",&licenses_base.m_pathname);
    _ss = &PTR__lazy_ostream_0056b7b0;
    local_1a8 = boost::unit_test::lazy_ostream::inst;
    local_218 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_210 = "";
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8;
    boost::test_tools::tt_detail::report_assertion(&license_name_norm,&ss,&local_218,0x21,2,1,0);
    std::__cxx11::string::~string((string *)local_3a8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&license_name_norm.field_2._M_allocated_capacity);
  }
  bVar1 = boost::algorithm::ends_with<std::__cxx11::string,char[5],boost::algorithm::is_equal>
                    (license_name,".lic");
  if (bVar1) {
    std::__cxx11::string::string((string *)&license_name_norm,(string *)license_name);
  }
  else {
    std::operator+(&license_name_norm,license_name,".lic");
  }
  std::__cxx11::string::string((string *)&ss,(string *)&license_name_norm);
  boost::filesystem::operator/(&license_fname,&licenses_base,(path *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&license_fname_s,(string *)&license_fname);
  remove(license_fname_s._M_dataplus._M_p);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&local_1a8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O2/extern/license-generator/src/license_generator/lccgen"
                          );
  std::operator<<(poVar3," license issue");
  poVar3 = std::operator<<((ostream *)&local_1a8," --primary-key ");
  std::operator<<(poVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/projects/DEFAULT/private_key.rsa"
                 );
  poVar3 = std::operator<<((ostream *)&local_1a8," --output-file-name ");
  std::operator<<(poVar3,(string *)&license_fname_s);
  poVar3 = std::operator<<((ostream *)&local_1a8," --project-folder ");
  std::operator<<(poVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O2/Testing/Temporary/DEFAULT"
                 );
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(other_args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(other_args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&local_1a8," ");
    std::operator<<(poVar3,(string *)
                           ((long)&(((other_args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar5));
    lVar5 = lVar5 + 0x20;
  }
  poVar3 = std::operator<<((ostream *)std::cout,"executing :");
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(poVar3,(string *)local_3a8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::stringbuf::str();
  iVar2 = system((char *)local_3a8._0_8_);
  std::__cxx11::string::~string((string *)local_3a8);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  retCode = iVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x33);
  local_3a8._8_8_ = local_3a8._8_8_ & 0xffffffffffffff00;
  local_3a8._0_8_ = &PTR__lazy_ostream_0056b5f0;
  local_3a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_390 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_240 = "";
  local_338 = (undefined **)((ulong)local_338._4_4_ << 0x20);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_3a8,&local_248,0x33,2,2,&retCode,"retCode",&local_338,"0");
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x34);
  bVar1 = boost::filesystem::exists(&license_fname);
  local_338 = (undefined **)CONCAT71(local_338._1_7_,bVar1);
  local_330 = 0;
  sStack_328.pi_ = (sp_counted_base *)0x0;
  local_3a8._8_8_ = local_3a8._8_8_ & 0xffffffffffffff00;
  local_3a8._0_8_ = &PTR__lazy_ostream_0056b830;
  local_3a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_390 = "license exists";
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_270 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_328);
  local_388._M_left = &local_388;
  local_388._M_color = _S_red;
  local_388._M_parent = (_Base_ptr)0x0;
  local_3a8._0_8_ = (pointer)0x0;
  local_3a8._8_8_ = 0;
  local_3a8._16_8_ = 0;
  local_368 = 0;
  local_360._M_next = &local_360;
  local_350 = 0;
  uStack_349 = 0;
  local_345 = true;
  local_344 = 0;
  local_388._M_right = local_388._M_left;
  local_360._M_prev = local_360._M_next;
  rc = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                 ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_3a8,
                  license_fname.m_pathname._M_dataplus._M_p);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_288,0x37);
  local_330 = local_330 & 0xffffffffffffff00;
  local_338 = &PTR__lazy_ostream_0056b5f0;
  sStack_328.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_320 = "";
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_2a0 = "";
  sectionSize = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,SI_Error,int>
            (&local_338,&local_2a8,0x37,2,7,&rc,"rc",&sectionSize,"0");
  sectionSize = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                          ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                           local_3a8,"DEFAULT");
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x39);
  local_330 = local_330 & 0xffffffffffffff00;
  local_338 = &PTR__lazy_ostream_0056b5f0;
  sStack_328.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_320 = "";
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_2d0 = "";
  local_3ec = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::gt_impl,int,int>
            (&local_338,&local_2d8,0x39,1,6,&sectionSize,"sectionSize",&local_3ec,"0");
  std::__cxx11::string::string((string *)local_418,(string *)&license_fname);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_3a8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&license_fname_s);
  std::__cxx11::string::~string((string *)&license_fname);
  std::__cxx11::string::~string((string *)&license_name_norm);
  std::__cxx11::string::~string((string *)&licenses_base);
  std::__cxx11::string::~string((string *)&lcc_exe);
  return local_418;
}

Assistant:

string generate_license(const string& license_name, const vector<string>& other_args) {
	fs::path lcc_exe(LCC_EXE);
	BOOST_REQUIRE_MESSAGE(fs::is_regular_file(lcc_exe), "License generator not found: " LCC_EXE);
	fs::path licenses_base(LCC_LICENSES_BASE);
	if (!fs::exists(licenses_base)) {
		BOOST_REQUIRE_MESSAGE(fs::create_directories(licenses_base), "test folders created " + licenses_base.string());
	}
	const string license_name_norm = boost::ends_with(license_name, ".lic") ? license_name : (license_name + ".lic");
	const fs::path license_fname(licenses_base / license_name_norm);
	const string license_fname_s = license_fname.string();
	remove(license_fname_s.c_str());

	stringstream ss;
	ss << LCC_EXE << " license issue";
	ss << " --" PARAM_PRIMARY_KEY " " << LCC_PROJECT_PRIVATE_KEY;
	ss << " --" PARAM_LICENSE_OUTPUT " " << license_fname_s;
	ss << " --" PARAM_PROJECT_FOLDER " " << LCC_TEST_LICENSES_PROJECT;

	for (size_t i = 0; i < other_args.size(); i++) {
		ss << " " << other_args[i];
	}
	cout << "executing :" << ss.str() << endl;
	const int retCode = std::system(ss.str().c_str());
	BOOST_REQUIRE_EQUAL(retCode, 0);
	BOOST_REQUIRE_MESSAGE(fs::exists(license_fname), "license exists");
	CSimpleIniA ini;
	const SI_Error rc = ini.LoadFile(license_fname.c_str());
	BOOST_REQUIRE_GE(rc, 0);
	const int sectionSize = ini.GetSectionSize(LCC_PROJECT_NAME);
	BOOST_CHECK_GT(sectionSize, 0);
	return license_fname.string();
}